

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_LBackward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  float fVar1;
  float fVar2;
  _ComplexT _Var3;
  char cVar4;
  complex<float> **ppcVar5;
  complex<float> *pcVar6;
  long lVar7;
  complex<float> *pcVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  complex<float> *pcVar16;
  undefined8 *puVar17;
  float fVar19;
  undefined8 uVar18;
  float fVar20;
  float fVar21;
  long local_88;
  undefined4 extraout_var_00;
  
  lVar11 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar10 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
             _vptr_TPZSavable[0xc])();
  if (((lVar11 != CONCAT44(extraout_var,iVar10)) ||
      (cVar4 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed,
      cVar4 == '\x03')) || (cVar4 == '\0')) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<float>>::Subst_LBackward(TPZFMatrix<TVar> *) const [TVar = std::complex<float>]"
               ,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
  }
  iVar10 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
             _vptr_TPZSavable[0xc])();
  lVar11 = CONCAT44(extraout_var_00,iVar10);
  if (1 < lVar11) {
    local_88 = lVar11 * 8 + -0x10;
    do {
      lVar13 = lVar11 + -1;
      if (0 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) {
        lVar14 = 0;
        lVar15 = 0;
        do {
          ppcVar5 = (this->fElem).fStore;
          pcVar6 = ppcVar5[lVar11];
          if ((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow < lVar11) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar16 = ppcVar5[lVar13] + 1;
          if (pcVar16 < pcVar6) {
            lVar7 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
            pcVar8 = B->fElem;
            lVar12 = lVar7 * lVar15;
            fVar1 = *(float *)&pcVar8[lVar12 + lVar13]._M_value;
            fVar2 = *(float *)((long)&pcVar8[lVar12 + lVar13]._M_value + 4);
            puVar17 = (undefined8 *)((long)&pcVar8->_M_value + lVar7 * lVar14 + local_88);
            do {
              _Var3 = pcVar16->_M_value;
              fVar19 = (float)(_Var3 >> 0x20);
              fVar21 = fVar1 * (float)_Var3 - fVar2 * fVar19;
              fVar20 = fVar1 * fVar19 + fVar2 * (float)_Var3;
              if ((NAN(fVar21)) && (NAN(fVar20))) {
                uVar18 = __mulsc3(_Var3,fVar19);
                fVar21 = (float)uVar18;
                fVar20 = (float)((ulong)uVar18 >> 0x20);
              }
              *puVar17 = CONCAT44((float)((ulong)*puVar17 >> 0x20) - fVar20,(float)*puVar17 - fVar21
                                 );
              pcVar16 = pcVar16 + 1;
              puVar17 = puVar17 + -1;
            } while (pcVar16 < pcVar6);
          }
          lVar15 = lVar15 + 1;
          lVar14 = lVar14 + 8;
        } while (lVar15 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol);
      }
      local_88 = local_88 + -8;
      bVar9 = 2 < lVar11;
      lVar11 = lVar13;
    } while (bVar9);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || !this->fDecomposed || this->fDecomposed == ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
    
    int64_t Dimension = this->Dim();
    for ( int64_t k = Dimension-1; k > 0; k-- ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            //		TVar val = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            // substract the column of the skyline matrix from the vector.
            
            TVar val = *BPtr;
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    return( 1 );
}